

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O2

AMQP_VALUE messaging_create_target(char *address)

{
  int iVar1;
  TARGET_HANDLE target;
  AMQP_VALUE address_value;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  char *pcVar4;
  
  target = target_create();
  if (target == (TARGET_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_create_target",0x41,1,"NULL target");
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  address_value = amqpvalue_create_string(address);
  if (address_value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar3 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_create_target",0x49,1,"Cannot create address AMQP string");
    }
    goto LAB_00116174;
  }
  iVar1 = target_set_address(target,address_value);
  if (iVar1 == 0) {
    pAVar3 = amqpvalue_create_target(target);
    if (pAVar3 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00116169;
      pcVar4 = "Cannot create target";
      iVar1 = 0x58;
      goto LAB_001160a2;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
LAB_00116169:
      pAVar3 = (AMQP_VALUE)0x0;
    }
    else {
      pcVar4 = "Cannot set address on target";
      iVar1 = 0x50;
LAB_001160a2:
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_create_target",iVar1,1,pcVar4);
    }
  }
  amqpvalue_destroy(address_value);
LAB_00116174:
  target_destroy(target);
  return pAVar3;
}

Assistant:

AMQP_VALUE messaging_create_target(const char* address)
{
    AMQP_VALUE result;
    TARGET_HANDLE target = target_create();

    if (target == NULL)
    {
        LogError("NULL target");
        result = NULL;
    }
    else
    {
        AMQP_VALUE address_value = amqpvalue_create_string(address);
        if (address_value == NULL)
        {
            LogError("Cannot create address AMQP string");
            result = NULL;
        }
        else
        {
            if (target_set_address(target, address_value) != 0)
            {
                LogError("Cannot set address on target");
                result = NULL;
            }
            else
            {
                result = amqpvalue_create_target(target);
                if (result == NULL)
                {
                    LogError("Cannot create target");
                }
                else
                {
                    /* all ok */
                }
            }

            amqpvalue_destroy(address_value);
        }

        target_destroy(target);
    }

    return result;
}